

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall GameBoard::draw(GameBoard *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *__x;
  pointer piVar4;
  string print_buffor;
  vector<int,_std::allocator<int>_> row;
  undefined1 *local_68;
  char *local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  clear();
  cbreak();
  noecho();
  nodelay(_stdscr,1);
  scrollok(_stdscr,0);
  local_68 = local_58;
  local_60 = (char *)0x0;
  local_58[0] = 0;
  __x = (this->board_matrix).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->board_matrix).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__x);
      piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
        pcVar3 = " ";
        if (*piVar4 - 1U < 5) {
          pcVar3 = &DAT_00105040 + *(int *)(&DAT_00105040 + (ulong)(*piVar4 - 1U) * 4);
        }
        std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,(ulong)pcVar3);
        printw(local_68);
        printw(" ");
        refresh();
      }
      printw("\n");
      refresh();
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void GameBoard::draw() {
    clear();
    cbreak();
    noecho();
    nodelay(stdscr, true);
    scrollok(stdscr, false);
    string print_buffor;
    for (vector<int> row: this->board_matrix) {
        for (int cell: row) {
            switch (cell) {
                case 5:
                    print_buffor = "#";
                    break;
                case 1:
                    print_buffor = "X";
                    break;
                case 4:
                    print_buffor = "@";
                    break;
                default: print_buffor = " ";
            }
//            cout << print_buffor << " ";
            printw(print_buffor.c_str());
            printw(" ");

            refresh();
        }
//        cout << endl;
//        char newline = '\n';
        printw("\n");
        refresh();
    }
//    cout << "\n\nsnake position: \nx: " << this->snakes[0]->head_y << " y:"<< this->snakes[0]->head_x;
//    cout << "\nilosc graczy: " << this->snakes.size() << endl;
}